

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cxx
# Opt level: O0

void outTime(string *name,size_t LEN,size_t FLOPS,double count)

{
  undefined1 auVar1 [16];
  _Setw _Var2;
  _Setprecision _Var3;
  ostream *poVar4;
  undefined8 in_RDX;
  ulong in_RSI;
  string *in_RDI;
  double in_XMM0_Qa;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar5 [64];
  
  _Var2 = std::setw(0xf);
  poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
  std::operator<<(poVar4,in_RDI);
  _Var2 = std::setw(0xf);
  poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::left);
  std::ostream::operator<<(poVar4,in_RSI);
  _Var3 = std::setprecision(8);
  std::operator<<((ostream *)&std::cout,_Var3);
  _Var2 = std::setw(0xf);
  poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
  std::ostream::operator<<(poVar4,in_XMM0_Qa);
  _Var2 = std::setw(0xf);
  poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::right);
  auVar5._8_56_ = extraout_var;
  auVar5._0_8_ = extraout_XMM0_Qa;
  auVar1 = vcvtusi2sd_avx512f(auVar5._0_16_,in_RDX);
  std::ostream::operator<<(poVar4,(auVar1._0_8_ / in_XMM0_Qa) / 1000000000.0);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void outTime(std::string name, size_t LEN, size_t FLOPS, double count) {

  std::cout << std::setw(15) << std::left  << name;
  std::cout << std::setw(15) << std::left << LEN;

  std::cout << std::setprecision(8);

  std::cout << std::setw(15) << std::right << count;
  std::cout << std::setw(15) << std::right << FLOPS/count/1.e9;

  std::cout << std::endl;



}